

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

void luaV_gettable(lua_State *L,TValue *t,TValue *key,StkId val)

{
  int iVar1;
  GCObject *t_00;
  Table *events;
  TValue *o;
  TValue *pTVar2;
  int iVar3;
  TValue *o2;
  
  iVar3 = 0x65;
  do {
    o = t;
    iVar3 = iVar3 + -1;
    if (iVar3 == 0) {
      luaG_runerror(L,"loop in gettable");
    }
    if (o->tt == 5) {
      t_00 = (o->value).gc;
      pTVar2 = luaH_get(&t_00->h,key);
      if (((pTVar2->tt != 0) || (events = (t_00->h).metatable, events == (Table *)0x0)) ||
         ((events->flags & 1) != 0)) {
LAB_00106c40:
        val->value = pTVar2->value;
        val->tt = pTVar2->tt;
        return;
      }
      t = luaT_gettm(events,TM_INDEX,L->l_G->tmname[0]);
      if (t == (TValue *)0x0) goto LAB_00106c40;
      iVar1 = t->tt;
    }
    else {
      t = luaT_gettmbyobj(L,o,TM_INDEX);
      iVar1 = t->tt;
      if (iVar1 == 0) {
        luaG_typeerror(L,o,"index");
      }
    }
    if (iVar1 == 6) {
      callTMres(L,val,t,o,key);
      return;
    }
  } while( true );
}

Assistant:

static void luaV_gettable(lua_State*L,const TValue*t,TValue*key,StkId val){
int loop;
for(loop=0;loop<100;loop++){
const TValue*tm;
if(ttistable(t)){
Table*h=hvalue(t);
const TValue*res=luaH_get(h,key);
if(!ttisnil(res)||
(tm=fasttm(L,h->metatable,TM_INDEX))==NULL){
setobj(L,val,res);
return;
}
}
else if(ttisnil(tm=luaT_gettmbyobj(L,t,TM_INDEX)))
luaG_typeerror(L,t,"index");
if(ttisfunction(tm)){
callTMres(L,val,tm,t,key);
return;
}
t=tm;
}
luaG_runerror(L,"loop in gettable");
}